

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
         *this)

{
  uint newSize;
  uint uVar1;
  EntryType *dst;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  hash_t hashCode;
  long lVar8;
  uint bucketCount;
  int *local_40;
  int *newBuckets;
  
  uVar5 = this->count;
  newSize = uVar5 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (bucketCount = uVar5 & 0x7fffffff, (uVar5 - 1 & bucketCount) != 0)) {
    iVar4 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar4 ^ 0x1f) & 0x1f);
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp<JITJavascriptString*,void*>,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp<JITJavascriptString*,void*>,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator>
              ((SimpleDictionaryEntryWithFixUp<JITJavascriptString_*,_void_*> *)newBuckets,
               (long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar4 = this->count;
    if (0 < iVar4) {
      lVar8 = 0;
      piVar3 = newBuckets;
      do {
        if (-2 < piVar3[lVar8 * 6 + 2]) {
          uVar2 = (ulong)*(uint *)(*(long *)(piVar3 + lVar8 * 6 + 4) + 0x18);
          if (uVar2 == 0) {
            hashCode = 0x2393b8b;
          }
          else {
            uVar5 = 0x811c9dc5;
            uVar6 = 0;
            do {
              uVar7 = *(ushort *)(*(long *)(*(long *)(piVar3 + lVar8 * 6 + 4) + 0x10) + uVar6 * 2) ^
                      uVar5;
              uVar5 = uVar7 * 0x1000193;
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
            hashCode = uVar7 * 0x2000326 + 1;
          }
          uVar1 = GetBucket(hashCode,bucketCount,this->modFunctionIndex);
          newBuckets[lVar8 * 6 + 2] = local_40[(int)uVar1];
          local_40[(int)uVar1] = (int)lVar8;
          iVar4 = this->count;
          piVar3 = newBuckets;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar4);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }